

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xer_encoder.c
# Opt level: O0

asn_enc_rval_t *
xer_encode(asn_TYPE_descriptor_t *td,void *sptr,xer_encoder_flags_e xer_flags,
          asn_app_consume_bytes_f *cb,void *app_key)

{
  int iVar1;
  xer_encoder_flags_e in_ECX;
  void *in_RDX;
  asn_TYPE_descriptor_s *in_RSI;
  asn_enc_rval_t *in_RDI;
  asn_app_consume_bytes_f *in_R8;
  void *in_R9;
  asn_enc_rval_t *tmp_error;
  int xcan;
  size_t mlen;
  char *mname;
  asn_enc_rval_t tmper;
  asn_enc_rval_t er;
  char *local_a0;
  asn_enc_rval_t local_88;
  int local_6c;
  size_t local_68;
  char *local_60;
  long local_58;
  asn_TYPE_descriptor_s *local_50;
  void *local_48;
  void *local_28;
  asn_app_consume_bytes_f *local_20;
  xer_encoder_flags_e local_14;
  void *local_10;
  asn_TYPE_descriptor_s *local_8;
  
  local_6c = 2;
  if ((in_ECX & XER_F_CANONICAL) != 0) {
    local_6c = 1;
  }
  local_10 = in_RDX;
  local_8 = in_RSI;
  if ((in_RSI != (asn_TYPE_descriptor_s *)0x0) && (in_RDX != (void *)0x0)) {
    local_60 = in_RSI->xml_tag;
    local_28 = in_R9;
    local_20 = in_R8;
    local_14 = in_ECX;
    local_68 = strlen(local_60);
    iVar1 = (*local_20)("<",1,local_28);
    if ((-1 < iVar1) &&
       ((iVar1 = (*local_20)(local_60,local_68,local_28), -1 < iVar1 &&
        (iVar1 = (*local_20)(">",1,local_28), -1 < iVar1)))) {
      (*local_8->xer_encoder)(&local_88,local_8,local_10,1,local_14,local_20,local_28);
      local_58 = local_88.encoded;
      local_50 = local_88.failed_type;
      local_48 = local_88.structure_ptr;
      if (local_88.encoded == -1) {
        in_RDI->encoded = -1;
        in_RDI->failed_type = local_88.failed_type;
        in_RDI->structure_ptr = local_88.structure_ptr;
        return in_RDI;
      }
      iVar1 = (*local_20)("</",2,local_28);
      if (((-1 < iVar1) && (iVar1 = (*local_20)(local_60,local_68,local_28), -1 < iVar1)) &&
         (iVar1 = (*local_20)(">\n",(long)local_6c,local_28), -1 < iVar1)) {
        in_RDI->encoded = (long)(local_6c + 4) + local_68 * 2 + local_58;
        in_RDI->failed_type = (asn_TYPE_descriptor_s *)0x0;
        in_RDI->structure_ptr = (void *)0x0;
        return in_RDI;
      }
    }
  }
  in_RDI->encoded = -1;
  in_RDI->failed_type = local_8;
  in_RDI->structure_ptr = local_10;
  if (local_8 == (asn_TYPE_descriptor_s *)0x0) {
    local_a0 = "";
  }
  else {
    local_a0 = local_8->name;
  }
  ASN_DEBUG("Failed to encode element %s",local_a0);
  return in_RDI;
}

Assistant:

asn_enc_rval_t
xer_encode(asn_TYPE_descriptor_t *td, void *sptr,
	enum xer_encoder_flags_e xer_flags,
		asn_app_consume_bytes_f *cb, void *app_key) {
	asn_enc_rval_t er, tmper;
	const char *mname;
	size_t mlen;
	int xcan = (xer_flags & XER_F_CANONICAL) ? 1 : 2;

	if(!td || !sptr) goto cb_failed;

	mname = td->xml_tag;
	mlen = strlen(mname);

	ASN__CALLBACK3("<", 1, mname, mlen, ">", 1);

	tmper = td->xer_encoder(td, sptr, 1, xer_flags, cb, app_key);
	if(tmper.encoded == -1) return tmper;

	ASN__CALLBACK3("</", 2, mname, mlen, ">\n", xcan);

	er.encoded = 4 + xcan + (2 * mlen) + tmper.encoded;

	ASN__ENCODED_OK(er);
cb_failed:
	ASN__ENCODE_FAILED;
}